

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O3

BadNameString * CLI::BadNameString::DashesOnly(BadNameString *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,"Must have a name, not just dashes: ",name);
  BadNameString(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static BadNameString DashesOnly(std::string name) {
        return BadNameString("Must have a name, not just dashes: " + name);
    }